

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O2

MPP_RET avs2d_parse_prepare_fast(Avs2dCtx_t *p_dec,MppPacket *pkt,HalDecTask *task)

{
  RK_U8 *pos;
  uint in_EAX;
  size_t sVar1;
  RK_U8 *buf_start;
  RK_U8 *pRVar2;
  ulong uStack_38;
  RK_U32 remain;
  
  uStack_38 = (ulong)in_EAX;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","In.","avs2d_parse_prepare_fast");
  }
  sVar1 = mpp_packet_get_length(pkt);
  buf_start = (RK_U8 *)mpp_packet_get_pos(pkt);
  pos = buf_start + (sVar1 & 0xffffffff);
  pRVar2 = buf_start + ((sVar1 & 0xffffffff) - 1);
  do {
    if (pRVar2 <= buf_start) goto LAB_0017dfb8;
    avs2_split_nalu(p_dec,buf_start,((int)pRVar2 - (int)buf_start) + 1,0,&remain);
  } while (((p_dec->new_frame_flag == 0) && (p_dec->p_nals[p_dec->nal_cnt - 1].eof != '\x01')) &&
          (buf_start = pos + -(ulong)remain, 1 < remain));
  task->valid = 1;
LAB_0017dfb8:
  mpp_packet_set_pos(pkt,pos);
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","after split, remain %d, task->valid %d\n","avs2d_parse_prepare_fast"
               ,uStack_38 >> 0x20,(ulong)task->valid);
    if (((byte)avs2d_parse_debug & 8) != 0) {
      _mpp_log_l(4,"avs2d_parse","Out.","avs2d_parse_prepare_fast");
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET avs2d_parse_prepare_fast(Avs2dCtx_t *p_dec, MppPacket *pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *p_curdata = NULL;
    RK_U8 *p_start = NULL;
    RK_U8 *p_end = NULL;
    RK_U32 pkt_length = 0;
    RK_U32 remain = 0;

    AVS2D_PARSE_TRACE("In.");

    pkt_length = (RK_U32) mpp_packet_get_length(pkt);

    p_curdata = p_start = (RK_U8 *) mpp_packet_get_pos(pkt);
    p_end = p_start + pkt_length - 1;

    while (p_curdata < p_end) {
        ret = avs2_split_nalu(p_dec, p_curdata, p_end - p_curdata + 1, 0, &remain);

        if (ret) {
            break;
        } else {
            p_curdata = p_end - remain + 1;
        }

        if (p_dec->new_frame_flag || (p_dec->p_nals[p_dec->nal_cnt - 1].eof == 1)
            || p_curdata >= p_end) {
            task->valid = 1;
            break;
        }
    }

    // sequence_end_code and video_edit_code at the end of a packet will be ignored.
    mpp_packet_set_pos(pkt, p_end + 1);
    AVS2D_PARSE_TRACE("after split, remain %d, task->valid %d\n", remain, task->valid);

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}